

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assignment.cpp
# Opt level: O2

ASTElement * __thiscall ninx::parser::element::Assignment::clone_impl(Assignment *this)

{
  tuple<ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
  in_RAX;
  Assignment *this_00;
  pointer *__ptr;
  __uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  local_18;
  
  local_18._M_t.
  super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
  .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl =
       (tuple<ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
        )(tuple<ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
          )in_RAX.
           super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
           .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl;
  this_00 = (Assignment *)operator_new(0x40);
  ASTElement::clone<ninx::parser::element::Expression>((ASTElement *)&local_18);
  Assignment(this_00,&this->name,
             (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
              *)&local_18);
  if (local_18._M_t.
      super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
      .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
       )0x0) {
    (**(code **)(*(_func_int **)
                  local_18._M_t.
                  super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
                  .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl +
                8))();
  }
  return (ASTElement *)this_00;
}

Assistant:

ninx::parser::element::ASTElement *ninx::parser::element::Assignment::clone_impl() {
    return new Assignment(this->name, this->value->clone<Expression>());
}